

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O2

void Io_NtkWritePos(FILE *pFile,Abc_Ntk_t *pNtk,int fWriteLatches)

{
  Abc_Obj_t *pAVar1;
  char *pcVar2;
  size_t sVar3;
  long *plVar4;
  int i;
  int iVar5;
  int iVar6;
  int iVar7;
  
  iVar7 = 8;
  iVar6 = 0;
  i = 0;
  if (fWriteLatches == 0) {
    while( true ) {
      if (pNtk->vCos->nSize <= i) break;
      plVar4 = (long *)Vec_PtrEntry(pNtk->vCos,i);
      pAVar1 = *(Abc_Obj_t **)
                (*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[4] * 8);
      pcVar2 = Abc_ObjName(pAVar1);
      sVar3 = strlen(pcVar2);
      iVar5 = (int)sVar3 + 1;
      if (iVar6 == 0) {
LAB_002cf91e:
        iVar6 = 0;
      }
      else if (0x4b < iVar7 + iVar5) {
        fwrite(" \\\n",3,1,(FILE *)pFile);
        iVar7 = 0;
        goto LAB_002cf91e;
      }
      pcVar2 = Abc_ObjName(pAVar1);
      fprintf((FILE *)pFile," %s",pcVar2);
      iVar7 = iVar7 + iVar5;
      iVar6 = iVar6 + 1;
      i = i + 1;
    }
  }
  else {
    for (; i < pNtk->vPos->nSize; i = i + 1) {
      pAVar1 = Abc_NtkPo(pNtk,i);
      pAVar1 = (Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray];
      pcVar2 = Abc_ObjName(pAVar1);
      sVar3 = strlen(pcVar2);
      iVar5 = (int)sVar3 + 1;
      if (iVar6 == 0) {
LAB_002cf895:
        iVar6 = 0;
      }
      else if (0x4b < iVar7 + iVar5) {
        fwrite(" \\\n",3,1,(FILE *)pFile);
        iVar7 = 0;
        goto LAB_002cf895;
      }
      pcVar2 = Abc_ObjName(pAVar1);
      fprintf((FILE *)pFile," %s",pcVar2);
      iVar7 = iVar7 + iVar5;
      iVar6 = iVar6 + 1;
    }
  }
  return;
}

Assistant:

void Io_NtkWritePos( FILE * pFile, Abc_Ntk_t * pNtk, int fWriteLatches )
{
    Abc_Obj_t * pTerm, * pNet;
    int LineLength;
    int AddedLength;
    int NameCounter;
    int i;

    LineLength  = 8;
    NameCounter = 0;

    if ( fWriteLatches )
    {
        Abc_NtkForEachPo( pNtk, pTerm, i )
        {
            pNet = Abc_ObjFanin0(pTerm);
            // get the line length after this name is written
            AddedLength = strlen(Abc_ObjName(pNet)) + 1;
            if ( NameCounter && LineLength + AddedLength + 3 > IO_WRITE_LINE_LENGTH )
            { // write the line extender
                fprintf( pFile, " \\\n" );
                // reset the line length
                LineLength  = 0;
                NameCounter = 0;
            }
            fprintf( pFile, " %s", Abc_ObjName(pNet) );
            LineLength += AddedLength;
            NameCounter++;
        }
    }
    else
    {
        Abc_NtkForEachCo( pNtk, pTerm, i )
        {
            pNet = Abc_ObjFanin0(pTerm);
            // get the line length after this name is written
            AddedLength = strlen(Abc_ObjName(pNet)) + 1;
            if ( NameCounter && LineLength + AddedLength + 3 > IO_WRITE_LINE_LENGTH )
            { // write the line extender
                fprintf( pFile, " \\\n" );
                // reset the line length
                LineLength  = 0;
                NameCounter = 0;
            }
            fprintf( pFile, " %s", Abc_ObjName(pNet) );
            LineLength += AddedLength;
            NameCounter++;
        }
    }
}